

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuObjIterPrepareAll(sqlite3rbu *p,RbuObjIter *pIter,int nOffset)

{
  char **ppcVar1;
  int *pRc;
  uchar uVar2;
  int iVar3;
  sqlite3 *psVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  char *pcVar11;
  char *pcVar12;
  char *p_00;
  char *pcVar13;
  char **ppcVar14;
  int *piVar15;
  u8 *puVar16;
  int i_1;
  char **in_RCX;
  undefined7 uVar17;
  uint i;
  sqlite3_stmt *psVar18;
  char *pcVar19;
  ulong uVar20;
  uchar *puVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  char *pcVar26;
  uint N;
  sqlite3_stmt *psVar27;
  long lVar28;
  int i_2;
  bool bVar29;
  undefined1 auVar30 [16];
  char *local_d8;
  char *local_c8;
  char **local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_90;
  sqlite3_stmt *local_88;
  uint local_7c;
  char *local_78;
  char *local_70;
  sqlite3_stmt *pList;
  sqlite3_stmt *psStack_60;
  sqlite3_stmt *local_58;
  sqlite3_stmt *psStack_50;
  char *local_48;
  sqlite3_stmt *local_40;
  sqlite3_stmt **local_38;
  
  if (pIter->pSelect != (sqlite3_stmt *)0x0) goto LAB_0012ae78;
  if (pIter->azTblCol == (char **)0x0) {
    local_40 = (sqlite3_stmt *)0x0;
    pcVar19 = pIter->zTbl;
    local_58 = (sqlite3_stmt *)0x0;
    psStack_50 = (sqlite3_stmt *)0x0;
    pList = (sqlite3_stmt *)0x0;
    psStack_60 = (sqlite3_stmt *)0x0;
    pIter->eType = 0;
    pIter->iPkTnum = 0;
    psVar4 = p->dbMain;
    ppcVar1 = &p->zErrmsg;
    iVar8 = 0;
    pcVar11 = sqlite3_mprintf("SELECT (sql LIKE \'create virtual%%\'), rootpage  FROM sqlite_master WHERE name=%Q"
                              ,pcVar19);
    iVar7 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar11);
    psVar27 = pList;
    p->rc = iVar7;
    if ((iVar7 == 0) && (iVar7 = sqlite3_step(pList), iVar7 == 100)) {
      iVar8 = 0;
      iVar7 = sqlite3_column_int(psVar27,0);
      if (iVar7 == 0) {
        iVar8 = sqlite3_column_int(psVar27,1);
        psVar4 = p->dbMain;
        pcVar11 = sqlite3_mprintf("PRAGMA index_list=%Q",pcVar19);
        iVar7 = prepareFreeAndCollectError(psVar4,&psStack_60,ppcVar1,pcVar11);
        psVar27 = psStack_60;
        p->rc = iVar7;
        if (iVar7 == 0) {
          do {
            iVar5 = sqlite3_step(psVar27);
            iVar7 = 1;
            if (iVar5 != 100) {
              psVar4 = p->dbMain;
              pcVar19 = sqlite3_mprintf("PRAGMA table_info=%Q",pcVar19);
              iVar5 = prepareFreeAndCollectError(psVar4,&psStack_50,ppcVar1,pcVar19);
              psVar27 = psStack_50;
              p->rc = iVar5;
              if (iVar5 == 0) goto LAB_0012b3b9;
              goto LAB_0012ae53;
            }
            puVar10 = sqlite3_column_text(psVar27,3);
            puVar21 = sqlite3_column_text(psVar27,1);
          } while ((puVar21 == (uchar *)0x0 || puVar10 == (uchar *)0x0) || (*puVar10 != 'p'));
          psVar4 = p->dbMain;
          pcVar19 = sqlite3_mprintf("SELECT rootpage FROM sqlite_master WHERE name = %Q",puVar21);
          iVar7 = prepareFreeAndCollectError(psVar4,&local_58,ppcVar1,pcVar19);
          psVar27 = local_58;
          p->rc = iVar7;
          if (iVar7 == 0) {
            iVar7 = sqlite3_step(local_58);
            if (iVar7 == 100) {
              iVar7 = sqlite3_column_int(psVar27,0);
              pIter->iPkTnum = iVar7;
              iVar7 = 3;
            }
            else {
              iVar7 = 4;
            }
            goto LAB_0012a14d;
          }
        }
      }
      else {
        iVar7 = 5;
LAB_0012a14d:
        pIter->eType = iVar7;
      }
    }
LAB_0012ae53:
    pRc = &p->rc;
    for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
      rbuFinalize(p,(&pList)[lVar25]);
    }
    if (*pRc != 0) goto LAB_0012ae78;
    if (pIter->eType == 0) {
      *pRc = 1;
      pcVar19 = sqlite3_mprintf("no such table: %s",pIter->zTbl);
      *ppcVar1 = pcVar19;
      if (*pRc != 0) goto LAB_0012ae78;
    }
    if (pIter->zIdx == (char *)0x0) {
      pIter->iTnum = iVar8;
    }
    psVar4 = p->dbRbu;
    local_c0 = (char **)0x0;
    in_RCX = (char **)sqlite3_mprintf("SELECT * FROM \'%q\'",pIter->zDataTbl);
    iVar7 = prepareFreeAndCollectError(psVar4,&local_40,ppcVar1,(char *)in_RCX);
    psVar27 = local_40;
    p->rc = iVar7;
    uVar6 = 0;
    if (iVar7 == 0) {
      if (local_40 == (sqlite3_stmt *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (uint)*(ushort *)(local_40 + 0xc0);
      }
      uVar20 = (ulong)uVar6;
      ppcVar14 = (char **)rbuMalloc(p,uVar20 * 0x17);
      if (ppcVar14 != (char **)0x0) {
        pIter->azTblCol = ppcVar14;
        in_RCX = (char **)(ulong)(uVar6 * 8);
        pIter->azTblType = (char **)((long)ppcVar14 + (long)in_RCX);
        piVar15 = (int *)((long)ppcVar14 + (long)in_RCX + (long)in_RCX);
        pIter->aiSrcOrder = piVar15;
        piVar15 = piVar15 + uVar20;
        pIter->abTblPk = (u8 *)piVar15;
        puVar16 = (u8 *)((long)piVar15 + uVar20);
        pIter->abNotNull = puVar16;
        pIter->abIndexed = puVar16 + uVar20;
      }
    }
    for (N = 0; (*pRc == 0 && (N < uVar6)); N = N + 1) {
      pcVar19 = sqlite3_column_name(psVar27,N);
      iVar7 = sqlite3_strnicmp("rbu_",pcVar19,4);
      if (iVar7 == 0) {
        iVar7 = sqlite3_stricmp("rbu_rowid",pcVar19);
        in_RCX = local_c0;
        if (iVar7 == 0) {
          in_RCX = (char **)0x1;
          local_c0 = in_RCX;
        }
      }
      else {
        pcVar19 = rbuStrndup(pcVar19,pRc);
        iVar7 = pIter->nTblCol;
        in_RCX = (char **)(long)iVar7;
        pIter->aiSrcOrder[(long)in_RCX] = iVar7;
        pIter->nTblCol = iVar7 + 1;
        pIter->azTblCol[(long)in_RCX] = pcVar19;
      }
    }
    sqlite3_finalize(psVar27);
    local_40 = (sqlite3_stmt *)0x0;
    iVar7 = *pRc;
    if (iVar7 == 0) {
      if ((p->zTarget != (char *)0x0) && ((uint)local_c0 != ((pIter->eType & 0xfffffffbU) == 1))) {
        *pRc = 1;
        pcVar19 = "may not have";
        if ((uint)local_c0 == 0) {
          pcVar19 = "requires";
        }
        pcVar19 = sqlite3_mprintf("table %q %s rbu_rowid column",pIter->zDataTbl,pcVar19);
        *ppcVar1 = pcVar19;
        iVar7 = *pRc;
        in_RCX = ppcVar1;
        psVar27 = (sqlite3_stmt *)0x0;
        if (iVar7 != 0) goto LAB_0012b0d0;
      }
      psVar4 = p->dbMain;
      in_RCX = (char **)sqlite3_mprintf("PRAGMA table_info(%Q)",pIter->zTbl);
      iVar7 = prepareFreeAndCollectError(psVar4,&local_40,ppcVar1,(char *)in_RCX);
      p->rc = iVar7;
      psVar27 = local_40;
    }
    else {
      psVar27 = (sqlite3_stmt *)0x0;
    }
LAB_0012b0d0:
    iVar8 = 0;
    while (((iVar7 == 0 && (iVar7 = sqlite3_step(psVar27), iVar7 == 100)) &&
           (puVar10 = sqlite3_column_text(psVar27,1), puVar10 != (uchar *)0x0))) {
      iVar7 = pIter->nTblCol;
      lVar28 = (long)iVar8;
      lVar25 = lVar28;
      iVar5 = iVar7;
      if (iVar7 < iVar8) {
        iVar5 = iVar8;
      }
      for (; lVar25 < iVar7; lVar25 = lVar25 + 1) {
        iVar9 = strcmp((char *)puVar10,pIter->azTblCol[lVar25]);
        if (iVar9 == 0) {
          iVar5 = (int)lVar25;
          break;
        }
      }
      if (iVar5 == iVar7) {
        *pRc = 1;
        pcVar19 = sqlite3_mprintf("column missing from %q: %s",pIter->zDataTbl,puVar10);
        *ppcVar1 = pcVar19;
        in_RCX = ppcVar1;
      }
      else {
        iVar7 = sqlite3_column_int(psVar27,5);
        iVar9 = sqlite3_column_int(psVar27,3);
        puVar10 = sqlite3_column_text(psVar27,2);
        if (iVar5 != iVar8) {
          piVar15 = pIter->aiSrcOrder;
          iVar3 = piVar15[iVar5];
          piVar15[iVar5] = piVar15[lVar28];
          piVar15[lVar28] = iVar3;
          ppcVar14 = pIter->azTblCol;
          pcVar19 = ppcVar14[iVar5];
          ppcVar14[iVar5] = ppcVar14[lVar28];
          pIter->azTblCol[lVar28] = pcVar19;
        }
        pcVar19 = rbuStrndup((char *)puVar10,pRc);
        in_RCX = pIter->azTblType;
        in_RCX[lVar28] = pcVar19;
        pIter->abTblPk[lVar28] = iVar7 != 0;
        local_a8._0_1_ = (char)iVar9;
        pIter->abNotNull[lVar28] = (char)local_a8 != '\0' || iVar7 != 0;
        iVar8 = iVar8 + 1;
      }
      iVar7 = *pRc;
    }
    rbuFinalize(p,psVar27);
    pList = (sqlite3_stmt *)0x0;
    iVar7 = p->rc;
    if (iVar7 == 0) {
      memcpy(pIter->abIndexed,pIter->abTblPk,(long)pIter->nTblCol);
      psVar4 = p->dbMain;
      in_RCX = (char **)sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
      iVar7 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,(char *)in_RCX);
      p->rc = iVar7;
    }
    psVar27 = pList;
    pIter->nIndex = 0;
    bVar29 = true;
    while ((iVar7 == 0 && (iVar7 = sqlite3_step(psVar27), iVar7 == 100))) {
      puVar10 = sqlite3_column_text(psVar27,1);
      iVar7 = sqlite3_column_int(psVar27,4);
      local_88 = (sqlite3_stmt *)0x0;
      if (puVar10 == (uchar *)0x0) break;
      if (iVar7 != 0) {
        memset(pIter->abIndexed,1,(long)pIter->nTblCol);
      }
      psVar4 = p->dbMain;
      in_RCX = (char **)sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar10);
      iVar7 = prepareFreeAndCollectError(psVar4,&local_88,ppcVar1,(char *)in_RCX);
      psVar18 = local_88;
      p->rc = iVar7;
      while ((iVar7 == 0 && (iVar7 = sqlite3_step(psVar18), iVar7 == 100))) {
        uVar6 = sqlite3_column_int(psVar18,1);
        if (-1 < (int)uVar6) {
          in_RCX = (char **)pIter->abIndexed;
          *(char *)((long)in_RCX + (ulong)uVar6) = '\x01';
        }
        iVar7 = *pRc;
      }
      rbuFinalize(p,psVar18);
      pIter->nIndex = pIter->nIndex + 1;
      iVar7 = p->rc;
      bVar29 = false;
    }
    if (pIter->eType == 4) {
      pIter->nIndex = pIter->nIndex + -1;
    }
    rbuFinalize(p,psVar27);
    if (bVar29) {
      pIter->abIndexed = (u8 *)0x0;
    }
  }
  if (p->rc != 0) goto LAB_0012ae78;
  uVar6 = pIter->iTnum;
  pcVar19 = pIter->zIdx;
  if (nOffset == 0) {
LAB_0012a062:
    local_48 = (char *)0x0;
  }
  else {
    local_48 = sqlite3_mprintf(" LIMIT -1 OFFSET %d",(ulong)(uint)nOffset);
    if (local_48 == (char *)0x0) {
      p->rc = 7;
      goto LAB_0012a062;
    }
  }
  local_38 = &pIter->pSelect;
  ppcVar1 = &p->zErrmsg;
  if (pcVar19 == (char *)0x0) {
    iVar7 = pIter->eType;
    uVar17 = (undefined7)((ulong)in_RCX >> 8);
    uVar6 = (uint)CONCAT71(uVar17,1);
    if ((iVar7 != 1) && (iVar7 != 5)) {
      if (iVar7 == 3) {
        uVar6 = (uint)CONCAT71(uVar17,p->zTarget == (char *)0x0);
      }
      else {
        uVar6 = 0;
      }
    }
    local_78 = (char *)CONCAT44(local_78._4_4_,uVar6);
    pcVar19 = pIter->zTbl;
    local_d8 = rbuObjIterGetBindlist(p,(uVar6 & 0xff) + pIter->nTblCol);
    pcVar22 = rbuObjIterGetWhere(p,pIter);
    pcVar12 = rbuObjIterGetOldlist(p,pIter,"old");
    p_00 = rbuObjIterGetOldlist(p,pIter,"new");
    local_c0 = (char **)0x0;
    pcVar11 = "";
    for (lVar25 = 0; lVar25 < pIter->nTblCol; lVar25 = lVar25 + 1) {
      local_c0 = (char **)rbuMPrintf(p,"%z%s\"%w\"",local_c0,pcVar11,pIter->azTblCol[lVar25]);
      pcVar11 = ", ";
    }
    pIter->nCol = pIter->nTblCol;
    iVar8 = p->rc;
    iVar7 = pIter->eType;
    if (iVar8 == 0) {
      pcVar11 = "";
      if (iVar7 != 5) {
        iVar7 = pIter->iTnum;
        sqlite3_test_control(0x19,p->dbMain,"main",0);
        pcVar13 = "";
        lVar25 = 0;
        pcVar11 = (char *)0x0;
        while (p->rc == 0) {
          if (pIter->nTblCol <= lVar25) {
            if (pIter->eType == 4) {
              pList = (sqlite3_stmt *)0x0;
              local_88 = (sqlite3_stmt *)0x0;
              psVar4 = p->dbMain;
              pcVar13 = sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
              iVar8 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar13);
              psVar27 = pList;
              p->rc = iVar8;
              goto LAB_0012ac85;
            }
            break;
          }
          pcVar23 = pIter->azTblCol[lVar25];
          pList = (sqlite3_stmt *)0x0;
          iVar8 = sqlite3_table_column_metadata
                            (p->dbMain,"main",pIter->zTbl,pcVar23,(char **)0x0,(char **)&pList,
                             (int *)0x0,(int *)0x0,(int *)0x0);
          p->rc = iVar8;
          pcVar24 = "";
          if ((pIter->eType == 2) && (pcVar24 = "PRIMARY KEY ", pIter->abTblPk[lVar25] == '\0')) {
            pcVar24 = "";
          }
          pcVar26 = " NOT NULL";
          if (pIter->abNotNull[lVar25] == '\0') {
            pcVar26 = "";
          }
          pcVar11 = rbuMPrintf(p,"%z%s\"%w\" %s %sCOLLATE %Q%s",pcVar11,pcVar13,pcVar23,
                               pIter->azTblType[lVar25],pcVar24,pList,pcVar26);
          lVar25 = lVar25 + 1;
          pcVar13 = ", ";
        }
        goto LAB_0012b569;
      }
      goto LAB_0012a826;
    }
    goto LAB_0012a7ed;
  }
  local_70 = pIter->zTbl;
  iVar7 = p->rc;
  pList = (sqlite3_stmt *)0x0;
  local_7c = uVar6;
  if (iVar7 == 0) {
    psVar4 = p->dbMain;
    pcVar19 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",pIter->zIdx);
    iVar7 = prepareFreeAndCollectError(psVar4,&pList,ppcVar1,pcVar19);
  }
  psVar27 = pList;
  local_a8 = (char *)0x0;
  uVar20 = 0;
  local_c8 = "";
  local_90 = "";
  local_b0 = (char *)0x0;
  pcVar11 = (char *)0x0;
  local_c0 = (char **)0x0;
  while ((iVar8 = (int)uVar20, iVar7 == 0 && (iVar5 = sqlite3_step(psVar27), iVar5 == 100))) {
    uVar6 = sqlite3_column_int(psVar27,1);
    iVar7 = sqlite3_column_int(psVar27,3);
    puVar10 = sqlite3_column_text(psVar27,4);
    if ((int)uVar6 < 0) {
      if (pIter->eType == 2) {
        lVar25 = 0;
        do {
          lVar28 = lVar25;
          lVar25 = lVar28 + 1;
        } while (pIter->abTblPk[lVar28] == '\0');
        pcVar19 = pIter->azTblCol[lVar28];
        local_78 = "INTEGER";
      }
      else {
        pcVar19 = ", rbu_rowid";
        if (p->zTarget == (char *)0x0) {
          pcVar19 = ", _rowid_";
        }
        pcVar19 = pcVar19 + 2;
        local_78 = "INTEGER";
      }
    }
    else {
      pcVar19 = pIter->azTblCol[uVar6];
      local_78 = pIter->azTblType[uVar6];
    }
    local_c0 = (char **)sqlite3_mprintf("%z%s\"%w\" COLLATE %Q",local_c0,local_c8,pcVar19,puVar10);
    if ((pIter->bUnique == 0) || (iVar5 = sqlite3_column_int(psVar27,5), iVar5 != 0)) {
      pcVar22 = " DESC";
      if (iVar7 == 0) {
        pcVar22 = "";
      }
      local_b0 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\"%s",local_b0,local_c8,uVar20,pcVar19,pcVar22);
    }
    pcVar11 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" %s COLLATE %Q",pcVar11,local_c8,uVar20,pcVar19,
                              local_78,puVar10);
    local_a8 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" IS ?",local_a8,local_90);
    auVar30._0_4_ = -(uint)((int)((ulong)local_c0 >> 0x20) == 0 && (int)local_c0 == 0);
    auVar30._4_4_ = -(uint)((int)local_b0 == 0 && (int)((ulong)local_b0 >> 0x20) == 0);
    auVar30._8_4_ = -(uint)((int)((ulong)pcVar11 >> 0x20) == 0 && (int)pcVar11 == 0);
    auVar30._12_4_ = -(uint)((int)local_a8 == 0 && (int)((ulong)local_a8 >> 0x20) == 0);
    iVar7 = movmskps((int)puVar10,auVar30);
    uVar20 = (ulong)(iVar8 + 1);
    if (iVar7 != 0) {
      iVar7 = 7;
    }
    local_c8 = ", ";
    local_90 = " AND ";
  }
  iVar5 = sqlite3_finalize(psVar27);
  if (iVar7 != 0) {
    iVar5 = iVar7;
  }
  if (iVar5 != 0) {
    sqlite3_free(local_c0);
    sqlite3_free(pcVar11);
    sqlite3_free(local_b0);
    sqlite3_free(local_a8);
    p->rc = iVar5;
    local_a8 = (char *)0x0;
    local_b0 = (char *)0x0;
    pcVar11 = (char *)0x0;
    local_c0 = (char **)0x0;
  }
  pcVar19 = local_48;
  pcVar22 = rbuObjIterGetBindlist(p,iVar8);
  pList = (sqlite3_stmt *)0x0;
  iVar7 = p->rc;
  if ((iVar7 == 0) &&
     (iVar7 = prepareAndCollectError
                        (p->dbMain,&pList,ppcVar1,
                         "SELECT trim(sql) FROM sqlite_master WHERE type=\'index\' AND name=?"),
     psVar27 = pList, iVar7 == 0)) {
    local_d8 = (char *)0x0;
    iVar5 = sqlite3_bind_text(pList,1,pIter->zIdx,-1,(_func_void_void_ptr *)0x0);
    local_88 = (sqlite3_stmt *)CONCAT44(local_88._4_4_,iVar5);
    if (iVar5 == 0) {
      iVar7 = sqlite3_step(psVar27);
      if (iVar7 == 100) {
        puVar10 = sqlite3_column_text(psVar27,0);
        if (puVar10 != (uchar *)0x0) {
          iVar7 = 0;
          uVar20 = 0;
          do {
            uVar6 = (uint)uVar20;
            uVar2 = puVar10[(int)uVar6];
            switch(uVar2) {
            case '\"':
            case '\'':
switchD_0012ad1e_caseD_22:
              do {
                do {
                  lVar25 = (long)(int)uVar20;
                  uVar20 = lVar25 + 1U & 0xffffffff;
                } while (puVar10[lVar25 + 1] != uVar2);
                uVar20 = lVar25 + 2;
              } while (puVar10[lVar25 + 2] == uVar2);
              uVar6 = (uint)(lVar25 + 1U);
              break;
            case '#':
            case '$':
            case '%':
            case '&':
              break;
            case '(':
              iVar7 = iVar7 + 1;
              break;
            case ')':
              iVar7 = iVar7 + -1;
              if (iVar7 == 0) {
                if (puVar10[(long)(int)uVar6 + 1] != '\0') {
                  local_d8 = rbuStrndup((char *)(puVar10 + (long)(int)uVar6 + 1),(int *)&local_88);
                  iVar5 = (int)local_88;
                  goto LAB_0012b409;
                }
                goto LAB_0012b401;
              }
              break;
            default:
              if (uVar2 == '[') {
                puVar21 = puVar10 + (long)(int)uVar6 + 1;
                do {
                  uVar6 = (int)uVar20 + 1;
                  uVar20 = (ulong)uVar6;
                  uVar2 = *puVar21;
                  puVar21 = puVar21 + 1;
                } while (uVar2 != ']');
              }
              else {
                if (uVar2 == '`') goto switchD_0012ad1e_caseD_22;
                if (uVar2 == '\0') goto LAB_0012b401;
              }
            }
            uVar20 = (ulong)(uVar6 + 1);
          } while( true );
        }
LAB_0012b401:
        local_d8 = (char *)0x0;
        iVar5 = 0;
LAB_0012b409:
        bVar29 = iVar5 == 0;
      }
      else {
        bVar29 = true;
        iVar5 = 0;
      }
    }
    else {
      bVar29 = false;
    }
    iVar7 = sqlite3_finalize(psVar27);
    pcVar19 = local_48;
    if (!bVar29) {
      iVar7 = iVar5;
    }
  }
  else {
    local_d8 = (char *)0x0;
  }
  p->rc = iVar7;
  sqlite3_test_control(0x19,p->dbMain,"main",0,1);
  sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)local_7c);
  rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
                 local_70,pcVar11,local_b0);
  sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  pIter->nCol = iVar8;
  iVar7 = p->rc;
  if (iVar7 == 0) {
    psVar4 = p->dbMain;
    pcVar12 = sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)",local_70,pcVar22);
    iVar7 = prepareFreeAndCollectError(psVar4,&pIter->pInsert,ppcVar1,pcVar12);
    p->rc = iVar7;
  }
  if (p->zTarget == (char *)0x0) {
LAB_0012a5d7:
    if (iVar7 == 0) {
      if (p->zTarget == (char *)0x0) {
        pcVar12 = sqlite3_mprintf("SELECT %s, 0 AS rbu_control FROM \'%q\' %s ORDER BY %s%s",
                                  local_c0,pIter->zDataTbl,local_d8,local_c0,pcVar19);
      }
      else if ((pIter->eType | 2U) == 3) {
        pcVar12 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s ORDER BY %s%s",
                                  local_c0,p->zStateDb,pIter->zDataTbl,local_d8,local_c0,pcVar19);
      }
      else {
        pcVar12 = "AND";
        if (local_d8 == (char *)0x0) {
          pcVar12 = "WHERE";
        }
        pcVar12 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s UNION ALL SELECT %s, rbu_control FROM \'%q\' %s %s typeof(rbu_control)=\'integer\' AND rbu_control!=1 ORDER BY %s%s"
                                  ,local_c0,p->zStateDb,pIter->zDataTbl,local_d8,local_c0,
                                  pIter->zDataTbl,local_d8,pcVar12,local_c0,pcVar19);
      }
      iVar7 = prepareFreeAndCollectError(p->dbRbu,local_38,ppcVar1,pcVar12);
      p->rc = iVar7;
    }
  }
  else if (iVar7 == 0) {
    psVar4 = p->dbMain;
    pcVar12 = sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s",local_70,local_a8);
    iVar7 = prepareFreeAndCollectError(psVar4,&pIter->pDelete,ppcVar1,pcVar12);
    p->rc = iVar7;
    goto LAB_0012a5d7;
  }
  sqlite3_free(pcVar11);
  sqlite3_free(local_b0);
  sqlite3_free(local_a8);
  sqlite3_free(pcVar22);
  goto LAB_0012adfa;
  while (iVar5 = sqlite3_column_int(psVar27,5), iVar5 < 1) {
LAB_0012b3b9:
    iVar5 = sqlite3_step(psVar27);
    if (iVar5 != 100) goto LAB_0012a14d;
  }
  iVar7 = 2;
  goto LAB_0012a14d;
LAB_0012ac85:
  psVar18 = (sqlite3_stmt *)0x0;
  if ((iVar8 != 0) || (iVar8 = sqlite3_step(psVar27), iVar8 != 100)) goto LAB_0012b48a;
  puVar10 = sqlite3_column_text(psVar27,3);
  if ((puVar10 == (uchar *)0x0) ||
     (((*puVar10 != 'p' || (puVar10[1] != 'k')) || (puVar10[2] != '\0')))) {
    iVar8 = p->rc;
    goto LAB_0012ac85;
  }
  puVar10 = sqlite3_column_text(psVar27,1);
  if (puVar10 == (uchar *)0x0) {
    psVar18 = (sqlite3_stmt *)0x0;
  }
  else {
    psVar4 = p->dbMain;
    pcVar13 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar10);
    iVar8 = prepareFreeAndCollectError(psVar4,&local_88,ppcVar1,pcVar13);
    p->rc = iVar8;
    psVar18 = local_88;
  }
LAB_0012b48a:
  rbuFinalize(p,psVar27);
  pcVar23 = "PRIMARY KEY(";
  pcVar13 = (char *)0x0;
  while ((p->rc == 0 && (iVar8 = sqlite3_step(psVar18), iVar8 == 100))) {
    iVar8 = sqlite3_column_int(psVar18,5);
    if (iVar8 != 0) {
      puVar10 = sqlite3_column_text(psVar18,2);
      iVar8 = sqlite3_column_int(psVar18,3);
      pcVar24 = " DESC";
      if (iVar8 == 0) {
        pcVar24 = "";
      }
      pcVar13 = rbuMPrintf(p,"%z%s\"%w\"%s",pcVar13,pcVar23,puVar10,pcVar24);
      pcVar23 = ", ";
    }
  }
  pcVar13 = rbuMPrintf(p,"%z)",pcVar13);
  rbuFinalize(p,psVar18);
  if (pcVar13 != (char *)0x0) {
    pcVar11 = rbuMPrintf(p,"%z, %z",pcVar11,pcVar13);
  }
LAB_0012b569:
  sqlite3_test_control(0x19,p->dbMain,"main",1,iVar7);
  pcVar13 = " WITHOUT ROWID";
  if (pIter->eType != 4) {
    pcVar13 = "";
  }
  rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"(%z)%s",pIter->zTbl,pcVar11,pcVar13);
  sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  iVar8 = p->rc;
  iVar7 = pIter->eType;
  if (iVar8 == 0) {
    if (iVar7 == 3) {
      iVar7 = pIter->iPkTnum;
      pList = (sqlite3_stmt *)0x0;
      local_88 = (sqlite3_stmt *)0x0;
      iVar8 = prepareAndCollectError
                        (p->dbMain,&pList,ppcVar1,
                         "SELECT name FROM sqlite_master WHERE rootpage = ?");
      psVar27 = pList;
      p->rc = iVar8;
      local_70 = (char *)CONCAT44(local_70._4_4_,iVar7);
      if (iVar8 == 0) {
        sqlite3_bind_int(pList,1,iVar7);
        iVar7 = sqlite3_step(psVar27);
        if (iVar7 != 100) goto LAB_0012b6cf;
        puVar10 = sqlite3_column_text(psVar27,0);
        psVar18 = (sqlite3_stmt *)0x0;
        if (puVar10 != (uchar *)0x0) {
          psVar4 = p->dbMain;
          pcVar11 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar10);
          iVar7 = prepareFreeAndCollectError(psVar4,&local_88,ppcVar1,pcVar11);
          p->rc = iVar7;
          psVar18 = local_88;
        }
      }
      else {
LAB_0012b6cf:
        psVar18 = (sqlite3_stmt *)0x0;
      }
      rbuFinalize(p,psVar27);
      local_a0 = (char *)0x0;
      pcVar13 = (char *)0x0;
      pcVar11 = "";
      while ((p->rc == 0 && (iVar7 = sqlite3_step(psVar18), iVar7 == 100))) {
        iVar7 = sqlite3_column_int(psVar18,5);
        if (iVar7 != 0) {
          uVar6 = sqlite3_column_int(psVar18,1);
          local_7c = sqlite3_column_int(psVar18,3);
          puVar10 = sqlite3_column_text(psVar18,4);
          pcVar13 = rbuMPrintf(p,"%z%sc%d %s COLLATE %Q",pcVar13,pcVar11,(ulong)uVar6,
                               pIter->azTblType[(int)uVar6],puVar10);
          pcVar23 = " DESC";
          if (local_7c == 0) {
            pcVar23 = "";
          }
          local_a0 = rbuMPrintf(p,"%z%sc%d%s",local_a0,pcVar11,(ulong)uVar6,pcVar23);
          pcVar11 = ", ";
        }
      }
      pcVar11 = rbuMPrintf(p,"%z, id INTEGER",pcVar13);
      rbuFinalize(p,psVar18);
      sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)local_70 & 0xffffffff);
      rbuMPrintfExec(p,p->dbMain,"CREATE TABLE rbu_imposter2(%z, PRIMARY KEY(%z)) WITHOUT ROWID",
                     pcVar11,local_a0);
      sqlite3_test_control(0x19,p->dbMain,"main",0,0);
      iVar8 = p->rc;
      pcVar11 = "rbu_imp_";
      if (pIter->eType == 5) {
        pcVar11 = "";
      }
      if (iVar8 != 0) goto LAB_0012a878;
    }
    else {
      pcVar11 = "rbu_imp_";
      if (iVar7 == 5) {
        pcVar11 = "";
      }
    }
LAB_0012a826:
    pcVar13 = "";
    psVar4 = p->dbMain;
    if ((char)local_78 != '\0') {
      pcVar13 = ", _rowid_";
    }
    pcVar13 = sqlite3_mprintf("INSERT INTO \"%s%w\"(%s%s) VALUES(%s)",pcVar11,pcVar19,local_c0,
                              pcVar13,local_d8);
    iVar8 = prepareFreeAndCollectError(psVar4,&pIter->pInsert,ppcVar1,pcVar13);
    p->rc = iVar8;
  }
  else {
LAB_0012a7ed:
    pcVar11 = "rbu_imp_";
    if (iVar7 == 5) {
      pcVar11 = "";
    }
  }
LAB_0012a878:
  if (p->zTarget != (char *)0x0) {
    if (iVar8 == 0) {
      psVar4 = p->dbMain;
      pcVar13 = sqlite3_mprintf("DELETE FROM \"%s%w\" WHERE %s",pcVar11,pcVar19,pcVar22);
      iVar8 = prepareFreeAndCollectError(psVar4,&pIter->pDelete,ppcVar1,pcVar13);
      p->rc = iVar8;
      if (p->zTarget == (char *)0x0) goto LAB_0012ab85;
    }
    if (pIter->abIndexed != (u8 *)0x0) {
      pcVar13 = ", rbu_rowid";
      if ((pIter->eType - 1U & 0xfffffffd) != 0) {
        pcVar13 = "";
      }
      pcVar23 = ", 0 AS rbu_rowid";
      if (pIter->eType != 3) {
        pcVar23 = "";
      }
      rbuMPrintfExec(p,p->dbRbu,
                     "CREATE TABLE IF NOT EXISTS %s.\'rbu_tmp_%q\' AS SELECT *%s FROM \'%q\' WHERE 0;"
                     ,p->zStateDb,pIter->zDataTbl,pcVar23,pIter->zDataTbl);
      rbuMPrintfExec(p,p->dbMain,
                     "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(4, %s);END;"
                     ,pcVar11,pcVar19,pcVar12,pcVar11,pcVar19,pcVar12,pcVar11,pcVar19,p_00);
      uVar6 = pIter->eType;
      if ((uVar6 | 2) == 3) {
        rbuMPrintfExec(p,p->dbMain,
                       "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(0, %s);END;"
                       ,pcVar11,pcVar19,p_00);
        uVar6 = pIter->eType;
      }
      pcVar19 = rbuObjIterGetBindlist(p,pIter->nTblCol + (uint)((uVar6 & 0xfffffffd) == 1) + 1);
      if (pcVar19 == (char *)0x0) {
        iVar8 = p->rc;
      }
      else {
        psVar4 = p->dbRbu;
        pcVar19 = sqlite3_mprintf("INSERT INTO %s.\'rbu_tmp_%q\'(rbu_control,%s%s) VALUES(%z)",
                                  p->zStateDb,pIter->zDataTbl,local_c0,pcVar13,pcVar19);
        iVar8 = prepareFreeAndCollectError(psVar4,&pIter->pTmpInsert,ppcVar1,pcVar19);
        p->rc = iVar8;
      }
    }
  }
LAB_0012ab85:
  pcVar19 = local_48;
  if (iVar8 == 0) {
    bVar29 = p->zTarget == (char *)0x0;
    pcVar11 = ",rbu_rowid";
    if (bVar29) {
      pcVar11 = ",_rowid_ ";
    }
    pcVar13 = "0 AS ";
    if (!bVar29) {
      pcVar13 = "";
    }
    psVar4 = p->dbRbu;
    if ((char)local_78 == '\0') {
      pcVar11 = "";
    }
    pcVar11 = sqlite3_mprintf("SELECT %s,%s rbu_control%s FROM \'%q\'%s",local_c0,pcVar13,pcVar11,
                              pIter->zDataTbl,local_48);
    iVar7 = prepareFreeAndCollectError(psVar4,local_38,ppcVar1,pcVar11);
    p->rc = iVar7;
  }
  sqlite3_free(pcVar22);
  sqlite3_free(pcVar12);
  sqlite3_free(p_00);
LAB_0012adfa:
  sqlite3_free(local_d8);
  sqlite3_free(local_c0);
  sqlite3_free(pcVar19);
LAB_0012ae78:
  return p->rc;
}

Assistant:

static int rbuObjIterPrepareAll(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  int nOffset                     /* Add "LIMIT -1 OFFSET $nOffset" to SELECT */
){
  assert( pIter->bCleanup==0 );
  if( pIter->pSelect==0 && rbuObjIterCacheTableInfo(p, pIter)==SQLITE_OK ){
    const int tnum = pIter->iTnum;
    char *zCollist = 0;           /* List of indexed columns */
    char **pz = &p->zErrmsg;
    const char *zIdx = pIter->zIdx;
    char *zLimit = 0;

    if( nOffset ){
      zLimit = sqlite3_mprintf(" LIMIT -1 OFFSET %d", nOffset);
      if( !zLimit ) p->rc = SQLITE_NOMEM;
    }

    if( zIdx ){
      const char *zTbl = pIter->zTbl;
      char *zImposterCols = 0;    /* Columns for imposter table */
      char *zImposterPK = 0;      /* Primary key declaration for imposter */
      char *zWhere = 0;           /* WHERE clause on PK columns */
      char *zBind = 0;
      char *zPart = 0;
      int nBind = 0;

      assert( pIter->eType!=RBU_PK_VTAB );
      zCollist = rbuObjIterGetIndexCols(
          p, pIter, &zImposterCols, &zImposterPK, &zWhere, &nBind
      );
      zBind = rbuObjIterGetBindlist(p, nBind);
      zPart = rbuObjIterGetIndexWhere(p, pIter);

      /* Create the imposter table used to write to this index. */
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 1);
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 1,tnum);
      rbuMPrintfExec(p, p->dbMain,
          "CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
          zTbl, zImposterCols, zImposterPK
      );
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 0);

      /* Create the statement to insert index entries */
      pIter->nCol = nBind;
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pInsert, &p->zErrmsg,
          sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)", zTbl, zBind)
        );
      }

      /* And to delete index entries */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pDelete, &p->zErrmsg,
          sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s", zTbl, zWhere)
        );
      }

      /* Create the SELECT statement to read keys in sorted order */
      if( p->rc==SQLITE_OK ){
        char *zSql;
        if( rbuIsVacuum(p) ){
          zSql = sqlite3_mprintf(
              "SELECT %s, 0 AS rbu_control FROM '%q' %s ORDER BY %s%s",
              zCollist, 
              pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else{
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s "
              "UNION ALL "
              "SELECT %s, rbu_control FROM '%q' "
              "%s %s typeof(rbu_control)='integer' AND rbu_control!=1 "
              "ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl, zPart,
              zCollist, pIter->zDataTbl, 
              zPart,
              (zPart ? "AND" : "WHERE"),
              zCollist, zLimit
          );
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz, zSql);
      }

      sqlite3_free(zImposterCols);
      sqlite3_free(zImposterPK);
      sqlite3_free(zWhere);
      sqlite3_free(zBind);
      sqlite3_free(zPart);
    }else{
      int bRbuRowid = (pIter->eType==RBU_PK_VTAB)
                    ||(pIter->eType==RBU_PK_NONE)
                    ||(pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p));
      const char *zTbl = pIter->zTbl;       /* Table this step applies to */
      const char *zWrite;                   /* Imposter table name */

      char *zBindings = rbuObjIterGetBindlist(p, pIter->nTblCol + bRbuRowid);
      char *zWhere = rbuObjIterGetWhere(p, pIter);
      char *zOldlist = rbuObjIterGetOldlist(p, pIter, "old");
      char *zNewlist = rbuObjIterGetOldlist(p, pIter, "new");

      zCollist = rbuObjIterGetCollist(p, pIter);
      pIter->nCol = pIter->nTblCol;

      /* Create the imposter table or tables (if required). */
      rbuCreateImposterTable(p, pIter);
      rbuCreateImposterTable2(p, pIter);
      zWrite = (pIter->eType==RBU_PK_VTAB ? "" : "rbu_imp_");

      /* Create the INSERT statement to write to the target PK b-tree */
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pInsert, pz,
            sqlite3_mprintf(
              "INSERT INTO \"%s%w\"(%s%s) VALUES(%s)", 
              zWrite, zTbl, zCollist, (bRbuRowid ? ", _rowid_" : ""), zBindings
            )
        );
      }

      /* Create the DELETE statement to write to the target PK b-tree.
      ** Because it only performs INSERT operations, this is not required for
      ** an rbu vacuum handle.  */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pDelete, pz,
            sqlite3_mprintf(
              "DELETE FROM \"%s%w\" WHERE %s", zWrite, zTbl, zWhere
            )
        );
      }

      if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
        const char *zRbuRowid = "";
        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zRbuRowid = ", rbu_rowid";
        }

        /* Create the rbu_tmp_xxx table and the triggers to populate it. */
        rbuMPrintfExec(p, p->dbRbu,
            "CREATE TABLE IF NOT EXISTS %s.'rbu_tmp_%q' AS "
            "SELECT *%s FROM '%q' WHERE 0;"
            , p->zStateDb, pIter->zDataTbl
            , (pIter->eType==RBU_PK_EXTERNAL ? ", 0 AS rbu_rowid" : "")
            , pIter->zDataTbl
        );

        rbuMPrintfExec(p, p->dbMain,
            "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(4, %s);"
            "END;",
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zNewlist
        );

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          rbuMPrintfExec(p, p->dbMain,
              "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" "
              "BEGIN "
              "  SELECT rbu_tmp_insert(0, %s);"
              "END;",
              zWrite, zTbl, zNewlist
          );
        }

        rbuObjIterPrepareTmpInsert(p, pIter, zCollist, zRbuRowid);
      }

      /* Create the SELECT statement to read keys from data_xxx */
      if( p->rc==SQLITE_OK ){
        const char *zRbuRowid = "";
        if( bRbuRowid ){
          zRbuRowid = rbuIsVacuum(p) ? ",_rowid_ " : ",rbu_rowid";
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz,
            sqlite3_mprintf(
              "SELECT %s,%s rbu_control%s FROM '%q'%s", 
              zCollist, 
              (rbuIsVacuum(p) ? "0 AS " : ""),
              zRbuRowid,
              pIter->zDataTbl, zLimit
            )
        );
      }

      sqlite3_free(zWhere);
      sqlite3_free(zOldlist);
      sqlite3_free(zNewlist);
      sqlite3_free(zBindings);
    }
    sqlite3_free(zCollist);
    sqlite3_free(zLimit);
  }
  
  return p->rc;
}